

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecNorm.c
# Opt level: O1

void Acec_InsertHadd(Gia_Man_t *pNew,int *In,int *Out)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Gia_ManAppendAnd2(pNew,*In,In[1]);
  Out[1] = iVar1;
  if ((-1 < *In) && (-1 < In[1])) {
    uVar2 = Gia_ManAppendAnd2(pNew,*In ^ 1,In[1] ^ 1);
    if ((-1 < Out[1]) && (-1 < (int)uVar2)) {
      iVar1 = Gia_ManAppendAnd2(pNew,Out[1] ^ 1,uVar2 ^ 1);
      if (-1 < iVar1) {
        *Out = iVar1;
        return;
      }
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Acec_InsertHadd( Gia_Man_t * pNew, int In[2], int Out[2] )
{
    int And, Or;
    Out[1] = Gia_ManAppendAnd2( pNew, In[0], In[1] );
    And    = Gia_ManAppendAnd2( pNew, Abc_LitNot(In[0]), Abc_LitNot(In[1]) );
    Or     = Gia_ManAppendOr2( pNew, Out[1], And );
    Out[0] = Abc_LitNot( Or );
}